

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkPrograms.hpp
# Opt level: O3

void __thiscall
vk::ProgramCollection<vk::SpirVAsmSource>::clear(ProgramCollection<vk::SpirVAsmSource> *this)

{
  undefined8 *puVar1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->m_programs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_programs)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    puVar1 = *(undefined8 **)(p_Var2 + 2);
    if (puVar1 != (undefined8 *)0x0) {
      if ((long *)*puVar1 != puVar1 + 2) {
        operator_delete((long *)*puVar1,puVar1[2] + 1);
      }
    }
    operator_delete(puVar1,0x20);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::SpirVAsmSource_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::SpirVAsmSource_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::SpirVAsmSource_*>_>_>
  ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::SpirVAsmSource_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::SpirVAsmSource_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::SpirVAsmSource_*>_>_>
           *)this);
  return;
}

Assistant:

void ProgramCollection<Program>::clear (void)
{
	for (typename ProgramMap::const_iterator i = m_programs.begin(); i != m_programs.end(); ++i)
		delete i->second;
	m_programs.clear();
}